

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long in_RCX;
  long *in_RDX;
  long in_RDI;
  bool bVar1;
  int ret;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int h;
  int w;
  Mat bottom_blob_bordered;
  int in_stack_00000150;
  int in_stack_00000154;
  Mat *in_stack_00000158;
  Mat *in_stack_00000160;
  Mat *in_stack_00000168;
  Mat *in_stack_00000170;
  Option *in_stack_000003b0;
  Mat *in_stack_000003b8;
  Mat *in_stack_000003c0;
  ConvolutionDepthWise *in_stack_000003c8;
  int in_stack_00000600;
  int in_stack_00000608;
  int in_stack_00000610;
  int in_stack_00000618;
  int in_stack_00000620;
  int in_stack_00000628;
  Mat *in_stack_00000630;
  Option *in_stack_00000638;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  Mat *in_stack_fffffffffffffe60;
  void *local_100;
  int *local_f8;
  undefined4 local_e8;
  long *local_e0;
  undefined4 local_d8;
  undefined4 local_cc;
  int local_c8;
  long local_c0;
  long *local_b0;
  int local_94;
  void **local_90;
  void **local_88;
  long *local_78;
  void **local_70;
  int local_58;
  undefined4 local_54;
  void **local_50;
  void *local_48;
  void **local_38;
  long *local_30;
  
  if (((*(byte *)(in_RCX + 0x1e) & 1) == 0) || (*(long *)(in_RDI + 0x178) != 1)) {
    local_90 = &local_100;
    local_100 = (void *)0x0;
    local_f8 = (int *)0x0;
    local_e8 = 0;
    local_e0 = (long *)0x0;
    local_d8 = 0;
    local_cc = 0;
    local_c8 = 0;
    local_c0 = 0;
    local_b0 = in_RDX;
    make_padding((ConvolutionDepthWise *)
                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 (Mat *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (Mat *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (Option *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_70 = &local_100;
    if (local_100 != (void *)0x0) {
      local_38 = local_70;
    }
    if (local_100 != (void *)0x0 && local_c0 * local_c8 != 0) {
      Mat::create(in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                  (int)in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                  CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                  (Allocator *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      local_78 = local_b0;
      bVar1 = true;
      if (*local_b0 != 0) {
        local_30 = local_b0;
        bVar1 = local_b0[8] * (long)(int)local_b0[7] == 0;
      }
      if (bVar1) {
        local_94 = -100;
      }
      else {
        local_94 = convolutiondepthwise
                             (in_stack_00000170,in_stack_00000168,in_stack_00000160,
                              in_stack_00000158,in_stack_00000154,in_stack_00000150,
                              in_stack_00000600,in_stack_00000608,in_stack_00000610,
                              in_stack_00000618,in_stack_00000620,in_stack_00000628,
                              in_stack_00000630,in_stack_00000638);
        if (local_94 == 0) {
          local_94 = 0;
        }
      }
    }
    else {
      local_94 = -100;
    }
    local_88 = &local_100;
    if (local_f8 != (int *)0x0) {
      local_54 = 0xffffffff;
      LOCK();
      local_58 = *local_f8;
      *local_f8 = *local_f8 + -1;
      UNLOCK();
      if (local_58 == 1) {
        local_50 = local_88;
        if (local_e0 == (long *)0x0) {
          local_48 = local_100;
          if (local_100 != (void *)0x0) {
            free(local_100);
          }
        }
        else {
          (**(code **)(*local_e0 + 0x18))(local_e0,local_100);
        }
      }
    }
  }
  else {
    local_94 = forward_int8(in_stack_000003c8,in_stack_000003c0,in_stack_000003b8,in_stack_000003b0)
    ;
  }
  return local_94;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolutiondepthwise(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}